

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall cs::compiler_type::try_fix_this_deduction(compiler_type *this,iterator it)

{
  token_base *ptVar1;
  bool bVar2;
  token_base **pptVar3;
  iterator iVar4;
  compile_error *this_00;
  iterator it_local;
  iterator local_90;
  iterator local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  
  if (it.mData != (tree_node *)0x0) {
    it_local = it;
    pptVar3 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    ptVar1 = *pptVar3;
    if (((ptVar1 != (token_base *)0x0) &&
        (ptVar1->_vptr_token_base == (_func_int **)&PTR__token_base_00248ed0)) &&
       (*(int *)&ptVar1[1]._vptr_token_base == 0xe)) {
      local_80._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_80);
      ptVar1 = *pptVar3;
      if ((ptVar1 != (token_base *)0x0) &&
         (ptVar1->_vptr_token_base == (_func_int **)&PTR__token_id_00249208)) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(ptVar1 + 3),"this");
        if (!bVar2) {
          local_80._M_dataplus._M_p =
               (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
          iVar4 = tree_type<cs::token_base_*>::iterator::left((iterator *)&local_80);
          if (iVar4.mData != (tree_node *)0x0) {
            local_60._M_dataplus._M_p =
                 (pointer)tree_type<cs::token_base_*>::iterator::left(&it_local);
            local_40._M_dataplus._M_p =
                 (pointer)tree_type<cs::token_base_*>::iterator::left((iterator *)&local_60);
            pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_40);
            if (*pptVar3 != (token_base *)0x0) {
              local_90 = tree_type<cs::token_base_*>::iterator::left(&it_local);
              local_88 = tree_type<cs::token_base_*>::iterator::left(&local_90);
              pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_88);
              ptVar1 = *pptVar3;
              local_20 = tree_type<cs::token_base_*>::iterator::right(&it_local);
              pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_20);
              if (ptVar1 == *pptVar3) {
                this_00 = (compile_error *)__cxa_allocate_exception(0x28);
                std::__cxx11::string::string
                          ((string *)&local_60,"Symbol collision with structure member \"",
                           (allocator *)&local_90);
                local_88 = tree_type<cs::token_base_*>::iterator::right(&it_local);
                pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_88);
                std::operator+(&local_40,&local_60,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (*pptVar3 + 3));
                std::operator+(&local_80,&local_40,"\".");
                compile_error::compile_error(this_00,&local_80);
                __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void compiler_type::try_fix_this_deduction(cs::tree_type<cs::token_base *>::iterator it)
	{
		if (!it.usable())
			return;
		token_signal *sig = dynamic_cast<token_signal *>(it.data());
		if (sig == nullptr || sig->get_signal() != signal_types::dot_)
			return;
		token_id *id = dynamic_cast<token_id *>(it.left().data());
		if (id == nullptr || id->get_id().get_id() != "this")
			return;
		// Check if it was generated by AST trimmer
		if (it.left().left().usable() && it.left().left().data() != nullptr &&
		        it.left().left().data() == it.right().data()) {
			// it.data() = it.right().data();
			throw compile_error(std::string("Symbol collision with structure member \"") +
			                    static_cast<token_id *>(it.right().data())->get_id().get_id() + "\".");
		}
	}